

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_CreateDirectory_Test::TestBody
          (CommandLineInterfaceTest_CreateDirectory_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  name._M_str = "bar/baz/foo.proto";
  name._M_len = 0x11;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "out";
  name_00._M_len = 3;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_00);
  name_01._M_str = "plugout";
  name_01._M_len = 7;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout --proto_path=$tmpdir bar/baz/foo.proto"
             ,(allocator<char> *)&local_c8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"test_generator",&local_c9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_651463 + 5,&local_ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"bar/baz/foo.proto",&local_cb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Foo",&local_cc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"out",&local_cd);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_c8,&local_48,&local_68,&local_88,&local_a8
            );
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"test_plugin",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_651463 + 5,&local_ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"bar/baz/foo.proto",&local_cb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Foo",&local_cc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"plugout",&local_cd);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_c8,&local_48,&local_68,&local_88,&local_a8
            );
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CreateDirectory) {
  // Test that when we output to a sub-directory, it is created.

  CreateTempFile("bar/baz/foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempDir("out");
  CreateTempDir("plugout");

  Run("protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout "
      "--proto_path=$tmpdir bar/baz/foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "bar/baz/foo.proto", "Foo", "out");
  ExpectGenerated("test_plugin", "", "bar/baz/foo.proto", "Foo", "plugout");
}